

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int ON_SubDHash::Compare(ON_SubDHash *lhs,ON_SubDHash *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = -1;
  iVar1 = iVar2;
  if ((rhs->m_vertex_count <= lhs->m_vertex_count) &&
     (iVar3 = 1, iVar1 = iVar3, lhs->m_vertex_count <= rhs->m_vertex_count)) {
    iVar1 = iVar2;
    if ((rhs->m_edge_count <= lhs->m_edge_count) &&
       (iVar1 = iVar3, lhs->m_edge_count <= rhs->m_edge_count)) {
      iVar1 = iVar2;
      if ((((rhs->m_face_count <= lhs->m_face_count) &&
           (iVar1 = iVar3, lhs->m_face_count <= rhs->m_face_count)) &&
          (iVar1 = ON_SHA1_Hash::Compare(&lhs->m_vertex_hash,&rhs->m_vertex_hash), iVar1 == 0)) &&
         (iVar1 = ON_SHA1_Hash::Compare(&lhs->m_edge_hash,&rhs->m_edge_hash), iVar1 == 0)) {
        iVar2 = ON_SHA1_Hash::Compare(&lhs->m_face_hash,&rhs->m_face_hash);
        return iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int ON_SubDHash::Compare(const ON_SubDHash& lhs, const ON_SubDHash& rhs)
{
  if (lhs.m_vertex_count < rhs.m_vertex_count)
    return -1;
  if (lhs.m_vertex_count > rhs.m_vertex_count)
    return 1;

  if (lhs.m_edge_count < rhs.m_edge_count)
    return -1;
  if (lhs.m_edge_count > rhs.m_edge_count)
    return 1;

  if (lhs.m_face_count < rhs.m_face_count)
    return -1;
  if (lhs.m_face_count > rhs.m_face_count)
    return 1;

  int rc;

  rc = ON_SHA1_Hash::Compare(lhs.m_vertex_hash, rhs.m_vertex_hash);
  if (0 != rc)
    return rc;

  rc = ON_SHA1_Hash::Compare(lhs.m_edge_hash, rhs.m_edge_hash);
  if (0 != rc)
    return rc;

  return ON_SHA1_Hash::Compare(lhs.m_face_hash, rhs.m_face_hash);
}